

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_get_var_nentry_test(btree_kv_ops *kv_ops)

{
  char *pcVar1;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var2;
  void *pvVar3;
  char *pcVar4;
  ushort uVar5;
  bnode *pbVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  char acStackY_f8 [12];
  uint16_t in_stack_ffffffffffffff14;
  uint8_t in_stack_ffffffffffffff16;
  uint8_t in_stack_ffffffffffffff17;
  char acStack_e8 [72];
  undefined8 uStack_a0;
  char *local_90;
  char *k_out;
  char **key;
  int local_78;
  ushort local_74;
  uint8_t vsize;
  uint8_t ksize;
  int n;
  idx_t idx;
  uint8_t v_out;
  uint8_t v;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  btree_kv_ops *kv_ops_local;
  
  uStack_a0 = 0x1028bc;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStack_a0 = 0x1028c9;
  memleak_start();
  local_78 = 10;
  key._7_1_ = 8;
  key._6_1_ = 1;
  k_out = acStack_e8;
  pcVar8 = acStackY_f8;
  local_90 = pcVar8;
  _n = dummy_node(in_stack_ffffffffffffff17,in_stack_ffffffffffffff16,in_stack_ffffffffffffff14);
  _n->nentry = (idx_t)local_78;
  ksize = 'd';
  for (local_74 = 0; (int)(uint)local_74 < local_78; local_74 = local_74 + 1) {
    pcVar8 = pcVar8 + -(ulong)(key._7_1_ + 0xf & 0xfffffff0);
    *(char **)(k_out + (ulong)local_74 * 8) = pcVar8;
    pcVar1 = *(char **)(k_out + (ulong)local_74 * 8);
    uVar9 = (ulong)local_74;
    pcVar8[-8] = -0x79;
    pcVar8[-7] = ')';
    pcVar8[-6] = '\x10';
    pcVar8[-5] = '\0';
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    sprintf(pcVar1,"key%d",uVar9);
    pbVar6 = _n;
    uVar5 = local_74;
    p_Var2 = kv_ops->set_kv;
    pvVar3 = *(void **)(k_out + (ulong)local_74 * 8);
    pcVar8[-8] = -0x54;
    pcVar8[-7] = ')';
    pcVar8[-6] = '\x10';
    pcVar8[-5] = '\0';
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    (*p_Var2)(pbVar6,uVar5,pvVar3,&ksize);
    ksize = ksize + '\x01';
  }
  ksize = 'd';
  local_74 = 0;
  do {
    pbVar6 = _n;
    uVar5 = local_74;
    pcVar1 = local_90;
    if (local_78 <= (int)(uint)local_74) {
      builtin_strncpy(pcVar8 + -8,"\x1a+\x10",4);
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      free(pbVar6);
      builtin_strncpy(pcVar8 + -8,"\x1f+\x10",4);
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      memleak_end();
      if (kv_get_var_nentry_test::__test_pass == 0) {
        builtin_strncpy(pcVar8 + -8,"h+\x10",4);
        pcVar8[-4] = '\0';
        pcVar8[-3] = '\0';
        pcVar8[-2] = '\0';
        pcVar8[-1] = '\0';
        fprintf(_stderr,"%s FAILED\n","kv_get_var_nentry_test");
      }
      else {
        builtin_strncpy(pcVar8 + -8,"G+\x10",4);
        pcVar8[-4] = '\0';
        pcVar8[-3] = '\0';
        pcVar8[-2] = '\0';
        pcVar8[-1] = '\0';
        fprintf(_stderr,"%s PASSED\n","kv_get_var_nentry_test");
      }
      return;
    }
    p_Var2 = kv_ops->get_kv;
    pcVar8[-8] = -5;
    pcVar8[-7] = ')';
    pcVar8[-6] = '\x10';
    pcVar8[-5] = '\0';
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    (*p_Var2)(pbVar6,uVar5,pcVar1,&vsize);
    pcVar4 = local_90;
    pcVar1 = *(char **)(k_out + (ulong)local_74 * 8);
    builtin_strncpy(pcVar8 + -8,"\x13*\x10",4);
    pcVar8[-4] = '\0';
    pcVar8[-3] = '\0';
    pcVar8[-2] = '\0';
    pcVar8[-1] = '\0';
    iVar7 = strcmp(pcVar4,pcVar1);
    if (iVar7 != 0) {
      builtin_strncpy(pcVar8 + -8,"<*\x10",4);
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0x13d);
      pcVar4 = local_90;
      kv_get_var_nentry_test::__test_pass = 0;
      pcVar1 = *(char **)(k_out + (ulong)local_74 * 8);
      builtin_strncpy(pcVar8 + -8,"^*\x10",4);
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      iVar7 = strcmp(pcVar4,pcVar1);
      if (iVar7 != 0) {
        pcVar8[-8] = -0x73;
        pcVar8[-7] = '*';
        pcVar8[-6] = '\x10';
        pcVar8[-5] = '\0';
        pcVar8[-4] = '\0';
        pcVar8[-3] = '\0';
        pcVar8[-2] = '\0';
        pcVar8[-1] = '\0';
        __assert_fail("!(strcmp(k_out, key[idx]))",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x13d,"void kv_get_var_nentry_test(btree_kv_ops *)");
      }
    }
    if (vsize != ksize) {
      pcVar8[-8] = -0x41;
      pcVar8[-7] = '*';
      pcVar8[-6] = '\x10';
      pcVar8[-5] = '\0';
      pcVar8[-4] = '\0';
      pcVar8[-3] = '\0';
      pcVar8[-2] = '\0';
      pcVar8[-1] = '\0';
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0x13e);
      kv_get_var_nentry_test::__test_pass = 0;
      if (vsize != ksize) {
        pcVar8[-8] = -10;
        pcVar8[-7] = '*';
        pcVar8[-6] = '\x10';
        pcVar8[-5] = '\0';
        pcVar8[-4] = '\0';
        pcVar8[-3] = '\0';
        pcVar8[-2] = '\0';
        pcVar8[-1] = '\0';
        __assert_fail("v_out == v",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x13e,"void kv_get_var_nentry_test(btree_kv_ops *)");
      }
    }
    ksize = ksize + '\x01';
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

void kv_get_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v, v_out;
    idx_t idx;
    int n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    char *k_out = alca(char, ksize);


    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;

    // set n keys
    for (idx = 0; idx < n; idx ++){
        key[idx] = alca(char, ksize);
        sprintf(key[idx], "key%d", idx);
        kv_ops->set_kv(node, idx, key[idx], (void *)&v);
        v++;
    }

    // get n keys
    v = 100;
    for (idx = 0; idx < n; idx ++){
        kv_ops->get_kv(node, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx])));
        TEST_CHK(v_out == v);
        v++;
    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_var_nentry_test");
}